

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Aggregate_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Aggregate_State_PDU *this)

{
  ostream *poVar1;
  pointer pAVar2;
  pointer pEVar3;
  pointer pSVar4;
  pointer pSVar5;
  pointer pKVar6;
  KString *pKVar7;
  ostream *poVar8;
  ulong uVar9;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  pointer pAVar10;
  pointer pEVar11;
  pointer pSVar12;
  pointer pSVar13;
  ushort uVar14;
  pointer pKVar15;
  KStringStream ss;
  KString local_4a8;
  KString *local_488;
  KString local_480;
  KString local_460;
  KString local_440;
  KString local_420;
  KString local_400;
  KString local_3e0;
  KString local_3c0;
  KString local_3a0;
  long *local_380;
  long local_378;
  long local_370 [2];
  KString local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_360._M_dataplus._M_p,local_360._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-Aggregate State PDU-\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Aggregate ID:\n",0xe);
  DATA_TYPE::AggregateIdentifier::GetAsString_abi_cxx11_(&local_480,&this->m_AggregateID);
  local_488 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar1 = (ostream *)(local_340 + 0x10);
  local_4a8._M_dataplus._M_p._0_1_ = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_4a8,1);
  if (local_480._M_string_length != 0) {
    uVar14 = 1;
    uVar9 = 0;
    do {
      local_4a8._M_dataplus._M_p._0_1_ = local_480._M_dataplus._M_p[uVar9];
      if ((local_480._M_string_length - 1 == uVar9) || ((char)local_4a8._M_dataplus._M_p != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_4a8,1);
      }
      else {
        local_4a8._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_4a8,1);
        local_4a8._M_dataplus._M_p._0_1_ = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_4a8,1);
      }
      uVar9 = (ulong)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar9 < local_480._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_380,local_378);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Force ID:                    ",0x1d);
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            ((KString *)local_340,(ENUMS *)(ulong)this->m_ui8ForceID,Value);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Aggregate State:             ",0x1d);
  DATA_TYPE::ENUMS::GetEnumAsStringAggregateState_abi_cxx11_
            (&local_4a8,(ENUMS *)(ulong)this->m_ui8AggState,Value_00);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)CONCAT71(local_4a8._M_dataplus._M_p._1_7_,
                                              (char)local_4a8._M_dataplus._M_p),
                      local_4a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  DATA_TYPE::AggregateType::GetAsString_abi_cxx11_(&local_3a0,&this->m_AggregateType);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Formation:                   ",0x1d);
  DATA_TYPE::ENUMS::GetEnumAsStringFormation_abi_cxx11_
            (&local_3c0,(ENUMS *)(ulong)this->m_ui32Formation,Value_01);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  DATA_TYPE::AggregateMarking::GetAsString_abi_cxx11_(&local_3e0,&this->m_AggregateMarking);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_3e0._M_dataplus._M_p,local_3e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Dimensions:                  ",0x1d);
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_400,&this->m_Dimensions);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_400._M_dataplus._M_p,local_400._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Orientation:                 ",0x1d);
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_420,&this->m_Ori);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_420._M_dataplus._M_p,local_420._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Center Of Mass:              ",0x1d);
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_440,&this->m_CtrOfMassLoc);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_440._M_dataplus._M_p,local_440._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Velocity:                    ",0x1d);
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_460,&this->m_Vel);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_460._M_dataplus._M_p,local_460._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Number Of Aggregates:        ",0x1d);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Number Of Entities:          ",0x1d);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Number Of Silent Aggregates: ",0x1d);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Number Of Silent Entities    ",0x1d);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_4a8._M_dataplus._M_p._1_7_,(char)local_4a8._M_dataplus._M_p) !=
      &local_4a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_4a8._M_dataplus._M_p._1_7_,(char)local_4a8._M_dataplus._M_p),
                    local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((ostream *)local_340._0_8_ != poVar1) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  pAVar10 = (this->m_vAI).
            super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (this->m_vAI).
           super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar10 != pAVar2) {
    do {
      (*(pAVar10->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase[2])
                (local_340,pAVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      if ((ostream *)local_340._0_8_ != poVar1) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
      pAVar10 = pAVar10 + 1;
    } while (pAVar10 != pAVar2);
  }
  pEVar11 = (this->m_vEI).
            super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->m_vEI).
           super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar11 != pEVar3) {
    do {
      (*(pEVar11->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase[2])
                (local_340,pEVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      if ((ostream *)local_340._0_8_ != poVar1) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
      pEVar11 = pEVar11 + 1;
    } while (pEVar11 != pEVar3);
  }
  if (this->m_ui16NumberOfPaddingOctets != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Padding:                 ",0x19);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," octets\n",8);
  }
  pSVar12 = (this->m_vSASL).
            super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (this->m_vSASL).
           super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar12 != pSVar4) {
    do {
      (*(pSVar12->super_DataTypeBase)._vptr_DataTypeBase[2])(local_340,pSVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      if ((ostream *)local_340._0_8_ != poVar1) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
      pSVar12 = pSVar12 + 1;
    } while (pSVar12 != pSVar4);
  }
  pSVar13 = (this->m_vSESL).
            super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar5 = (this->m_vSESL).
           super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar13 != pSVar5) {
    do {
      (*(pSVar13->super_DataTypeBase)._vptr_DataTypeBase[2])(local_340,pSVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      if ((ostream *)local_340._0_8_ != poVar1) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
      pSVar13 = pSVar13 + 1;
    } while (pSVar13 != pSVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Number Of Variable Datums:   ",0x1d)
  ;
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  pKVar15 = (this->m_vVD).
            super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pKVar6 = (this->m_vVD).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar15 != pKVar6) {
    do {
      (*(pKVar15->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(local_340);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      if ((ostream *)local_340._0_8_ != poVar1) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
      pKVar15 = pKVar15 + 1;
    } while (pKVar15 != pKVar6);
  }
  pKVar7 = local_488;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar7;
}

Assistant:

KString Aggregate_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Aggregate State PDU-\n"
       << "Aggregate ID:\n"
       << IndentString( m_AggregateID.GetAsString(), 1 )
       << "Force ID:                    " << GetEnumAsStringForceID( m_ui8ForceID )         << "\n"
       << "Aggregate State:             " << GetEnumAsStringAggregateState( m_ui8AggState ) << "\n"
       << m_AggregateType.GetAsString()
       << "Formation:                   " << GetEnumAsStringFormation( m_ui32Formation )    << "\n"
       << m_AggregateMarking.GetAsString()
       << "Dimensions:                  " << m_Dimensions.GetAsString()
       << "Orientation:                 " << m_Ori.GetAsString()
       << "Center Of Mass:              " << m_CtrOfMassLoc.GetAsString()
       << "Velocity:                    " << m_Vel.GetAsString()
       << "Number Of Aggregates:        " << m_ui16NumAggregates                            << "\n"
       << "Number Of Entities:          " << m_ui16NumEntities                              << "\n"
       << "Number Of Silent Aggregates: " << m_ui16NumSilentAggregateTypes                  << "\n"
       << "Number Of Silent Entities    " << m_ui16NumSilentEntityTypes                     << "\n";

    vector<AggregateIdentifier>::const_iterator citrAI = m_vAI.begin();
    vector<AggregateIdentifier>::const_iterator citrAIEnd = m_vAI.end();
    for( ; citrAI != citrAIEnd; ++citrAI )
    {
        ss << citrAI->GetAsString();
    }

    vector<EntityIdentifier>::const_iterator citrEI = m_vEI.begin();
    vector<EntityIdentifier>::const_iterator citrEIEnd = m_vEI.end();
    for( ; citrEI != citrEIEnd; ++citrEI )
    {
        ss << citrEI->GetAsString();
    }

    if (needsPadding())
    {
        ss << "Padding:                 " << m_ui16NumberOfPaddingOctets << " octets\n";
    }

    vector<SilentAggregateSystem>::const_iterator citrSAS = m_vSASL.begin();
    vector<SilentAggregateSystem>::const_iterator citrSASEnd = m_vSASL.end();
    for( ; citrSAS != citrSASEnd; ++citrSAS )
    {
        ss << citrSAS->GetAsString();
    }

    vector<SilentEntitySystem>::const_iterator citrSES = m_vSESL.begin();
    vector<SilentEntitySystem>::const_iterator citrSESEnd = m_vSESL.end();
    for( ; citrSES != citrSESEnd; ++citrSES )
    {
        ss << citrSES->GetAsString();
    }

    ss << "Number Of Variable Datums:   " << m_ui32NumVariableDatum << "\n";

    vector<VarDtmPtr>::const_iterator citrVD = m_vVD.begin();
    vector<VarDtmPtr>::const_iterator citrVDEnd = m_vVD.end();
    for( ; citrVD != citrVDEnd; ++citrVD )
    {
        ss << ( *citrVD )->GetAsString();
    }

    return ss.str();
}